

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int createCollation(sqlite3 *db,char *zName,u8 enc,void *pCtx,
                   _func_int_void_ptr_int_void_ptr_int_void_ptr *xCompare,_func_void_void_ptr *xDel)

{
  void *pvVar1;
  code *pcVar2;
  uint uVar3;
  HashElem *pHVar4;
  Vdbe *pVVar5;
  undefined7 in_register_00000011;
  int iVar6;
  CollSeq *pCVar7;
  long lVar8;
  uint uVar9;
  
  uVar3 = (uint)CONCAT71(in_register_00000011,enc);
  uVar9 = 2;
  if ((uVar3 - 4 & 0xfb) != 0) {
    uVar9 = uVar3;
  }
  if (uVar9 - 4 < 0xfffffffd) {
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x2a54a,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    return 0x15;
  }
  if (zName == (char *)0x0) {
    pCVar7 = db->pDfltColl;
  }
  else {
    pHVar4 = findElementWithHash(&db->aCollSeq,zName,(uint *)0x0);
    if (pHVar4->data == (void *)0x0) goto LAB_0012413b;
    pCVar7 = (CollSeq *)((long)pHVar4->data + (ulong)uVar9 * 0x28 + -0x28);
  }
  if ((pCVar7 != (CollSeq *)0x0) &&
     (pCVar7->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0)) {
    if (db->nVdbeActive != 0) {
      sqlite3ErrorWithMsg(db,5,"unable to delete/modify collation sequence due to active statements"
                         );
      return 5;
    }
    for (pVVar5 = db->pVdbe; pVVar5 != (Vdbe *)0x0; pVVar5 = pVVar5->pNext) {
      pVVar5->field_0xc6 = (pVVar5->field_0xc6 & 0xfc) + 1;
    }
    if (uVar9 == (pCVar7->enc & 0xfffffff7)) {
      lVar8 = 0;
      pHVar4 = findElementWithHash(&db->aCollSeq,zName,(uint *)0x0);
      pvVar1 = pHVar4->data;
      do {
        if (*(u8 *)((long)pvVar1 + lVar8 + 8) == pCVar7->enc) {
          pcVar2 = *(code **)((long)pvVar1 + lVar8 + 0x20);
          if (pcVar2 != (code *)0x0) {
            (*pcVar2)(*(undefined8 *)((long)pvVar1 + lVar8 + 0x10));
          }
          *(undefined8 *)((long)pvVar1 + lVar8 + 0x18) = 0;
        }
        lVar8 = lVar8 + 0x28;
      } while (lVar8 != 0x78);
    }
  }
LAB_0012413b:
  pCVar7 = sqlite3FindCollSeq(db,(byte)uVar9,zName,1);
  if (pCVar7 == (CollSeq *)0x0) {
    iVar6 = 7;
  }
  else {
    pCVar7->xCmp = xCompare;
    pCVar7->pUser = pCtx;
    pCVar7->xDel = xDel;
    pCVar7->enc = (byte)uVar9 | enc & 8;
    db->errCode = 0;
    if (db->pErr == (sqlite3_value *)0x0) {
      db->errByteOffset = -1;
      iVar6 = 0;
    }
    else {
      iVar6 = 0;
      sqlite3ErrorFinish(db,0);
    }
  }
  return iVar6;
}

Assistant:

static int createCollation(
  sqlite3* db,
  const char *zName,
  u8 enc,
  void* pCtx,
  int(*xCompare)(void*,int,const void*,int,const void*),
  void(*xDel)(void*)
){
  CollSeq *pColl;
  int enc2;

  assert( sqlite3_mutex_held(db->mutex) );

  /* If SQLITE_UTF16 is specified as the encoding type, transform this
  ** to one of SQLITE_UTF16LE or SQLITE_UTF16BE using the
  ** SQLITE_UTF16NATIVE macro. SQLITE_UTF16 is not used internally.
  */
  enc2 = enc;
  testcase( enc2==SQLITE_UTF16 );
  testcase( enc2==SQLITE_UTF16_ALIGNED );
  if( enc2==SQLITE_UTF16 || enc2==SQLITE_UTF16_ALIGNED ){
    enc2 = SQLITE_UTF16NATIVE;
  }
  if( enc2<SQLITE_UTF8 || enc2>SQLITE_UTF16BE ){
    return SQLITE_MISUSE_BKPT;
  }

  /* Check if this call is removing or replacing an existing collation
  ** sequence. If so, and there are active VMs, return busy. If there
  ** are no active VMs, invalidate any pre-compiled statements.
  */
  pColl = sqlite3FindCollSeq(db, (u8)enc2, zName, 0);
  if( pColl && pColl->xCmp ){
    if( db->nVdbeActive ){
      sqlite3ErrorWithMsg(db, SQLITE_BUSY,
        "unable to delete/modify collation sequence due to active statements");
      return SQLITE_BUSY;
    }
    sqlite3ExpirePreparedStatements(db, 0);

    /* If collation sequence pColl was created directly by a call to
    ** sqlite3_create_collation, and not generated by synthCollSeq(),
    ** then any copies made by synthCollSeq() need to be invalidated.
    ** Also, collation destructor - CollSeq.xDel() - function may need
    ** to be called.
    */
    if( (pColl->enc & ~SQLITE_UTF16_ALIGNED)==enc2 ){
      CollSeq *aColl = sqlite3HashFind(&db->aCollSeq, zName);
      int j;
      for(j=0; j<3; j++){
        CollSeq *p = &aColl[j];
        if( p->enc==pColl->enc ){
          if( p->xDel ){
            p->xDel(p->pUser);
          }
          p->xCmp = 0;
        }
      }
    }
  }

  pColl = sqlite3FindCollSeq(db, (u8)enc2, zName, 1);
  if( pColl==0 ) return SQLITE_NOMEM_BKPT;
  pColl->xCmp = xCompare;
  pColl->pUser = pCtx;
  pColl->xDel = xDel;
  pColl->enc = (u8)(enc2 | (enc & SQLITE_UTF16_ALIGNED));
  sqlite3Error(db, SQLITE_OK);
  return SQLITE_OK;
}